

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
* libcellml::getAllImportSources
            (vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
             *__return_storage_ptr__,ModelConstPtr *model)

{
  EntityImpl **ppEVar1;
  pointer psVar2;
  shared_ptr<libcellml::Component> *component;
  pointer psVar3;
  element_type *peVar4;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  importedUnits;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  importedComponents;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  local_60;
  shared_ptr<libcellml::ImportSource> local_48;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(model->super___shared_ptr<const_libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
  local_60.
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(model->super___shared_ptr<const_libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
  if ((element_type *)
      local_60.
      super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ppEVar1 = &(((element_type *)
                  local_60.
                  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->super_ComponentEntity).
                 super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
      *(int *)ppEVar1 = *(int *)ppEVar1 + 1;
      UNLOCK();
    }
    else {
      ppEVar1 = &(((element_type *)
                  local_60.
                  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->super_ComponentEntity).
                 super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
      *(int *)ppEVar1 = *(int *)ppEVar1 + 1;
    }
  }
  getImportedComponents(&local_38,(ComponentEntityConstPtr *)&local_60);
  if ((element_type *)
      local_60.
      super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_60.
               super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  getImportedUnits(&local_60,model);
  std::
  vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
  ::reserve(__return_storage_ptr__,
            ((long)local_60.
                   super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_60.
                   super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) +
            ((long)local_38.
                   super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_38.
                   super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  if (local_38.
      super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_38.
      super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar3 = local_38.
             super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ImportedEntity::importSource
                (&((psVar3->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_ImportedEntity);
      std::
      vector<std::shared_ptr<libcellml::ImportSource>,std::allocator<std::shared_ptr<libcellml::ImportSource>>>
      ::emplace_back<std::shared_ptr<libcellml::ImportSource>>
                ((vector<std::shared_ptr<libcellml::ImportSource>,std::allocator<std::shared_ptr<libcellml::ImportSource>>>
                  *)__return_storage_ptr__,&local_48);
      if (local_48.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != local_38.
                       super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  psVar2 = local_60.
           super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_60.
      super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    peVar4 = (element_type *)
             local_60.
             super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ImportedEntity::importSource
                ((ImportedEntity *)
                 ((peVar4->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                  super_Entity._vptr_Entity + 2));
      std::
      vector<std::shared_ptr<libcellml::ImportSource>,std::allocator<std::shared_ptr<libcellml::ImportSource>>>
      ::emplace_back<std::shared_ptr<libcellml::ImportSource>>
                ((vector<std::shared_ptr<libcellml::ImportSource>,std::allocator<std::shared_ptr<libcellml::ImportSource>>>
                  *)__return_storage_ptr__,&local_48);
      if (local_48.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      peVar4 = (element_type *)&peVar4->super_enable_shared_from_this<libcellml::Model>;
    } while (peVar4 != (element_type *)psVar2);
  }
  std::
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
  ~vector(&local_60);
  std::
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ImportSourcePtr> getAllImportSources(const ModelConstPtr &model)
{
    std::vector<ImportSourcePtr> importSources;

    auto importedComponents = getImportedComponents(model);
    auto importedUnits = getImportedUnits(model);

    importSources.reserve(importedComponents.size() + importedUnits.size());
    for (auto &component : importedComponents) {
        importSources.push_back(component->importSource());
    }
    for (auto &units : importedUnits) {
        importSources.push_back(units->importSource());
    }

    return importSources;
}